

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_func_get_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  VmFrame *pVVar1;
  jx9_vm *pjVar2;
  void *pvVar3;
  sxu32 sVar4;
  jx9_value *pjVar5;
  uint *puVar6;
  ulong uVar7;
  
  pVVar1 = pCtx->pVm->pFrame;
  if (pVVar1->pParent == (VmFrame *)0x0) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Called in the global scope");
  }
  else {
    pjVar5 = jx9_context_new_array(pCtx);
    if (pjVar5 != (jx9_value *)0x0) {
      sVar4 = (pVVar1->sArg).nUsed;
      if (sVar4 != 0) {
        puVar6 = (uint *)(pVVar1->sArg).pBase;
        uVar7 = 0;
        do {
          pjVar2 = pCtx->pVm;
          if (((*puVar6 < (pjVar2->aMemObj).nUsed) &&
              (pvVar3 = (pjVar2->aMemObj).pBase, pvVar3 != (void *)0x0)) &&
             ((pjVar5->iFlags & 0x40) != 0)) {
            HashmapInsert((jx9_hashmap *)(pjVar5->x).pOther,(jx9_value *)0x0,
                          (jx9_value *)((long)pvVar3 + (ulong)(*puVar6 * (pjVar2->aMemObj).eSize)));
            sVar4 = (pVVar1->sArg).nUsed;
          }
          uVar7 = uVar7 + 1;
          puVar6 = puVar6 + 4;
        } while (uVar7 < sVar4);
      }
      jx9MemObjStore(pjVar5,pCtx->pRet);
      return 0;
    }
  }
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_func_get_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pObj = 0;
	jx9_value *pArray;
	VmFrame *pFrame;
	VmSlot *aSlot;
	sxu32 n;
	/* Point to the current frame */
	pFrame = pCtx->pVm->pFrame;
	if( pFrame->pParent == 0 ){
		/* Global frame, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Called in the global scope");
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Start filling the array with the given arguments */
	aSlot = (VmSlot *)SySetBasePtr(&pFrame->sArg);
	for( n = 0;  n < SySetUsed(&pFrame->sArg) ; n++ ){
		pObj = (jx9_value *)SySetAt(&pCtx->pVm->aMemObj, aSlot[n].nIdx);
		if( pObj ){
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pObj);
		}
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}